

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f_wipe.cpp
# Opt level: O1

int wipe_CalcBurn(BYTE *burnarray,int width,int height,int density)

{
  BYTE *pBVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  BYTE *pBVar13;
  BYTE *pBVar14;
  BYTE *pBVar15;
  uint uVar16;
  BYTE *pBVar17;
  BYTE *pBVar18;
  int iVar19;
  
  iVar3 = height * width;
  iVar11 = density / 3 + wipe_CalcBurn::voop;
  iVar19 = density + 7;
  if (-1 < density) {
    iVar19 = density;
  }
  if (7 < density) {
    iVar19 = iVar19 >> 3;
    uVar8 = wipe_CalcBurn::voop;
    wipe_CalcBurn::voop = iVar11;
    do {
      uVar16 = uVar8 & width - 1U;
      uVar4 = FRandom::GenRand32(&M_Random);
      bVar2 = burnarray[(ulong)uVar16 + (long)iVar3];
      uVar5 = FRandom::GenRand32(&M_Random);
      uVar4 = (uVar5 & 0x1f) + (uVar4 >> 3 & 0x1f) + (uVar4 & 0xf) + (uint)bVar2 + 4;
      if (0xfe < uVar4) {
        uVar4 = 0xff;
      }
      burnarray[(ulong)((uVar16 + (width * 3) / 2 & width - 1U) + width * 2) + (long)iVar3] =
           (BYTE)uVar4;
      burnarray[(ulong)uVar16 + (long)iVar3] = (BYTE)uVar4;
      uVar8 = uVar8 + 1;
      iVar19 = iVar19 + -1;
      iVar11 = wipe_CalcBurn::voop;
    } while (iVar19 != 0);
  }
  wipe_CalcBurn::voop = iVar11;
  iVar19 = width * 7;
  if (density + 10 < width * 7) {
    iVar19 = density + 10;
  }
  if (-1 < height) {
    lVar6 = (long)(width * 2);
    lVar7 = (long)width;
    lVar12 = (long)(width * 4);
    pBVar13 = burnarray + lVar7 + 1;
    pBVar14 = burnarray + lVar12 + 1;
    pBVar15 = burnarray + lVar6 + 2;
    iVar11 = 0;
    pBVar17 = burnarray;
    do {
      pBVar1 = pBVar17 + lVar6;
      bVar2 = pBVar17[lVar12];
      uVar8 = (uint)pBVar17[lVar6 + 1] + (uint)pBVar17[lVar6] + (uint)pBVar1[lVar7 + -1] +
              (uint)bVar2;
      iVar10 = ((uVar8 >> 2) - 1) + (uint)(uVar8 < 8);
      *pBVar17 = (BYTE)iVar10;
      pBVar17[lVar7] = (BYTE)((uint)bVar2 + iVar10 >> 1);
      if (2 < width) {
        lVar9 = 0;
        do {
          bVar2 = pBVar14[lVar9];
          uVar8 = (uint)pBVar15[lVar9] + (uint)bVar2 +
                  (uint)pBVar15[lVar9 + -2] + (uint)pBVar15[lVar9 + -1];
          iVar10 = ((uVar8 >> 2) - 1) + (uint)(uVar8 < 8);
          pBVar17[lVar9 + 1] = (BYTE)iVar10;
          pBVar13[lVar9] = (BYTE)(iVar10 + (uint)bVar2 >> 1);
          lVar9 = lVar9 + 1;
        } while (width + -2 != (int)lVar9);
        pBVar17 = pBVar17 + lVar9;
      }
      pBVar18 = pBVar17 + 1;
      bVar2 = pBVar18[lVar12];
      uVar8 = (uint)pBVar18[(1 - lVar7) + lVar6] + (uint)pBVar17[lVar6] + (uint)pBVar18[lVar6] +
              (uint)bVar2;
      iVar10 = ((uVar8 >> 2) - 1) + (uint)(uVar8 < 8);
      *pBVar18 = (BYTE)iVar10;
      pBVar18[lVar7] = (BYTE)(iVar10 + (uint)bVar2 >> 1);
      iVar11 = iVar11 + 2;
      pBVar13 = pBVar13 + lVar6;
      pBVar14 = pBVar14 + lVar6;
      pBVar15 = pBVar15 + lVar6;
      pBVar17 = pBVar1;
    } while (iVar11 <= height);
  }
  if (iVar3 != 0) {
    lVar6 = 0;
    do {
      if (burnarray[lVar6] < 0x7e) {
        return iVar19;
      }
      lVar6 = lVar6 + 1;
    } while (iVar3 != (int)lVar6);
  }
  return -1;
}

Assistant:

int wipe_CalcBurn (BYTE *burnarray, int width, int height, int density)
{
	// This is a modified version of the fire that was once used
	// on the player setup menu.
	static int voop;

	int a, b;
	BYTE *from;

	// generator
	from = &burnarray[width * height];
	b = voop;
	voop += density / 3;
	for (a = 0; a < density/8; a++)
	{
		unsigned int offs = (a+b) & (width - 1);
		unsigned int v = M_Random();
		v = MIN(from[offs] + 4 + (v & 15) + (v >> 3) + (M_Random() & 31), 255u);
		from[offs] = from[width*2 + ((offs + width*3/2) & (width - 1))] = v;
	}

	density = MIN(density + 10, width * 7);

	from = burnarray;
	for (b = 0; b <= height; b += 2)
	{
		BYTE *pixel = from;

		// special case: first pixel on line
		BYTE *p = pixel + (width << 1);
		unsigned int top = *p + *(p + width - 1) + *(p + 1);
		unsigned int bottom = *(pixel + (width << 2));
		unsigned int c1 = (top + bottom) >> 2;
		if (c1 > 1) c1--;
		*pixel = c1;
		*(pixel + width) = (c1 + bottom) >> 1;
		pixel++;

		// main line loop
		for (a = 1; a < width-1; a++)
		{
			// sum top pixels
			p = pixel + (width << 1);
			top = *p + *(p - 1) + *(p + 1);

			// bottom pixel
			bottom = *(pixel + (width << 2));

			// combine pixels
			c1 = (top + bottom) >> 2;
			if (c1 > 1) c1--;

			// store pixels
			*pixel = c1;
			*(pixel + width) = (c1 + bottom) >> 1;		// interpolate

			// next pixel
			pixel++;
		}

		// special case: last pixel on line
		p = pixel + (width << 1);
		top = *p + *(p - 1) + *(p - width + 1);
		bottom = *(pixel + (width << 2));
		c1 = (top + bottom) >> 2;
		if (c1 > 1) c1--;
		*pixel = c1;
		*(pixel + width) = (c1 + bottom) >> 1;

		// next line
		from += width << 1;
	}

	// Check for done-ness. (Every pixel with level 126 or higher counts as done.)
	for (a = width * height, from = burnarray; a != 0; --a, ++from)
	{
		if (*from < 126)
		{
			return density;
		}
	}
	return -1;
}